

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_str_scanfn(arg_str *parent,char *argval)

{
  int iVar1;
  
  iVar1 = parent->count;
  if (iVar1 == (parent->hdr).maxcount) {
    return 2;
  }
  if (argval == (char *)0x0) {
    parent->count = iVar1 + 1;
  }
  else {
    parent->count = iVar1 + 1;
    parent->sval[iVar1] = argval;
  }
  return 0;
}

Assistant:

static int arg_str_scanfn(struct arg_str * parent, const char * argval) {
	int errorcode = 0;

	if (parent->count == parent->hdr.maxcount) {
		/* maximum number of arguments exceeded */
		errorcode = EMAXCOUNT;
	} else if (!argval) {
		/* a valid argument with no argument value was given. */
		/* This happens when an optional argument value was invoked. */
		/* leave parent arguiment value unaltered but still count the argument. */
		parent->count++;
	} else {
		parent->sval[parent->count++] = argval;
	}

	ARG_TRACE(("%s:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
	return errorcode;
}